

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

bool __thiscall Tokens::IsReservada(Tokens *this,string *palavra)

{
  int iVar1;
  long lVar2;
  char *__dest;
  char *__src;
  char *lower;
  string *palavra_local;
  Tokens *this_local;
  
  lVar2 = std::__cxx11::string::size();
  __dest = (char *)operator_new__(lVar2 + 1);
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(__dest,__src);
  iVar1 = strcasecmp(__dest,"program");
  if (iVar1 == 0) {
    setToken(this,0x27);
    this_local._7_1_ = true;
  }
  else {
    iVar1 = strcasecmp(__dest,"var");
    if (iVar1 == 0) {
      setToken(this,0x28);
      this_local._7_1_ = true;
    }
    else {
      iVar1 = strcasecmp(__dest,"integer");
      if (iVar1 == 0) {
        setToken(this,0x25);
        this_local._7_1_ = true;
      }
      else {
        iVar1 = strcasecmp(__dest,"begin");
        if (iVar1 == 0) {
          setToken(this,0x22);
          this_local._7_1_ = true;
        }
        else {
          iVar1 = strcasecmp(__dest,"end");
          if (iVar1 == 0) {
            setToken(this,0x2b);
            this_local._7_1_ = true;
          }
          else {
            iVar1 = strcasecmp(__dest,"function");
            if (iVar1 == 0) {
              setToken(this,0x23);
              this_local._7_1_ = true;
            }
            else {
              iVar1 = strcasecmp(__dest,"procedure");
              if (iVar1 == 0) {
                setToken(this,0x26);
                this_local._7_1_ = true;
              }
              else {
                iVar1 = strcasecmp(__dest,"if");
                if (iVar1 == 0) {
                  setToken(this,0x1f);
                  this_local._7_1_ = true;
                }
                else {
                  iVar1 = strcasecmp(__dest,"then");
                  if (iVar1 == 0) {
                    setToken(this,0x20);
                    this_local._7_1_ = true;
                  }
                  else {
                    iVar1 = strcasecmp(__dest,"else");
                    if (iVar1 == 0) {
                      setToken(this,0x21);
                      this_local._7_1_ = true;
                    }
                    else {
                      iVar1 = strcasecmp(__dest,"while");
                      if (iVar1 == 0) {
                        setToken(this,0x29);
                        this_local._7_1_ = true;
                      }
                      else {
                        iVar1 = strcasecmp(__dest,"do");
                        if (iVar1 == 0) {
                          setToken(this,0x2a);
                          this_local._7_1_ = true;
                        }
                        else {
                          this_local._7_1_ = false;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Tokens::IsReservada (string palavra){
  char *lower;
  lower = new char[palavra.size()+1];
  strcpy (lower, palavra.c_str());
  if (strcasecmp(lower,"program") == 0) {
    setToken (PROGRAM);
    return true;
  }
  if (strcasecmp(lower, "var") == 0) {
    setToken (VAR);
    return true;
  }
  if (strcasecmp(lower,"integer") == 0) {
    setToken (INTEGER);
    return true;
  }
  if (strcasecmp(lower,"begin") == 0) {
    setToken (BEGIN);
    return true;
  }
  if (strcasecmp(lower,"end") == 0) {
    setToken (END);
    return true;
  }
  if (strcasecmp(lower,"function") == 0) {
    setToken (FUNCTION);
    return true;
  }
  if (strcasecmp(lower,"procedure") == 0) {
    setToken (PROCEDURE);
    return true;
  }
  if (strcasecmp(lower,"if") == 0) {
    setToken (IF);
    return true;
  }
  if (strcasecmp(lower,"then") == 0) {
    setToken (THEN);
    return true;
  }
  if (strcasecmp(lower,"else") == 0) {
    setToken (ELSE);
    return true;
  }
  if (strcasecmp(lower,"while") == 0) {
    setToken (WHILE);
    return true;
  }
  if (strcasecmp(lower, "do") == 0) {
    setToken (DO);
    return true;
  }
  return false;
}